

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardgestures.cpp
# Opt level: O0

Result __thiscall
QPanGestureRecognizer::recognize
          (QPanGestureRecognizer *this,QGesture *state,QObject *param_3,QEvent *event)

{
  Type TVar1;
  GestureState GVar2;
  QPanGesturePrivate *pQVar3;
  QList<QEventPoint> *pQVar4;
  qsizetype qVar5;
  QEvent *in_RCX;
  long in_RDI;
  long in_FS_OFFSET;
  qreal qVar6;
  QPointF QVar7;
  QTouchEvent *ev_1;
  QTouchEvent *ev;
  QPanGesturePrivate *d;
  QPanGesture *q;
  Result result;
  undefined4 in_stack_ffffffffffffff38;
  ResultFlag in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  QList<QEventPoint> *in_stack_ffffffffffffff48;
  Int local_60;
  Int local_5c;
  undefined8 in_stack_ffffffffffffffa8;
  int maxCount;
  qreal local_48;
  qreal local_40;
  Int local_38;
  Int local_34;
  qreal local_30;
  qreal local_28;
  QPointF local_20;
  Int local_10;
  QFlagsStorage<QGestureRecognizer::ResultFlag> local_c;
  long local_8;
  
  maxCount = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QPanGesture::d_func((QPanGesture *)0x353f3e);
  local_c.i = 0xaaaaaaaa;
  QFlags<QGestureRecognizer::ResultFlag>::QFlags
            ((QFlags<QGestureRecognizer::ResultFlag> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3c
            );
  TVar1 = QEvent::type(in_RCX);
  if (TVar1 == TouchBegin) {
    QFlags<QGestureRecognizer::ResultFlag>::QFlags
              ((QFlags<QGestureRecognizer::ResultFlag> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff3c);
    local_c.i = local_10;
    QPointF::QPointF(&local_20);
    (pQVar3->offset).xp = local_20.xp;
    (pQVar3->offset).yp = local_20.yp;
    (pQVar3->lastOffset).xp = (pQVar3->offset).xp;
    (pQVar3->lastOffset).yp = (pQVar3->offset).yp;
    pQVar3->pointCount = *(int *)(in_RDI + 8);
  }
  else if (TVar1 == TouchUpdate) {
    pQVar4 = QPointerEvent::points((QPointerEvent *)in_RCX);
    qVar5 = QList<QEventPoint>::size(pQVar4);
    if (pQVar3->pointCount <= qVar5) {
      (pQVar3->lastOffset).xp = (pQVar3->offset).xp;
      (pQVar3->lastOffset).yp = (pQVar3->offset).yp;
      QPointerEvent::points((QPointerEvent *)in_RCX);
      QVar7 = panOffset(in_stack_ffffffffffffff48,maxCount);
      local_48 = QVar7.xp;
      (pQVar3->offset).xp = local_48;
      local_40 = QVar7.yp;
      (pQVar3->offset).yp = local_40;
      qVar6 = QPointF::x(&pQVar3->offset);
      if ((((10.0 < qVar6) || (qVar6 = QPointF::y(&pQVar3->offset), 10.0 < qVar6)) ||
          (qVar6 = QPointF::x(&pQVar3->offset), qVar6 < -10.0)) ||
         (qVar6 = QPointF::y(&pQVar3->offset), qVar6 < -10.0)) {
        QPointerEvent::points((QPointerEvent *)in_RCX);
        QList<QEventPoint>::first
                  ((QList<QEventPoint> *)
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        QEventPoint::globalPressPosition();
        QGesture::setHotSpot
                  ((QGesture *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (QPointF *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        QFlags<QGestureRecognizer::ResultFlag>::QFlags
                  ((QFlags<QGestureRecognizer::ResultFlag> *)
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff3c);
        local_c.i = local_5c;
      }
      else {
        QFlags<QGestureRecognizer::ResultFlag>::QFlags
                  ((QFlags<QGestureRecognizer::ResultFlag> *)
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff3c);
        local_c.i = local_60;
      }
    }
  }
  else if (TVar1 == TouchEnd) {
    GVar2 = QGesture::state((QGesture *)0x354031);
    if (GVar2 == NoGesture) {
      QFlags<QGestureRecognizer::ResultFlag>::QFlags
                ((QFlags<QGestureRecognizer::ResultFlag> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c);
      local_c.i = local_38;
    }
    else {
      pQVar4 = QPointerEvent::points((QPointerEvent *)in_RCX);
      qVar5 = QList<QEventPoint>::size(pQVar4);
      if (qVar5 == pQVar3->pointCount) {
        (pQVar3->lastOffset).xp = (pQVar3->offset).xp;
        (pQVar3->lastOffset).yp = (pQVar3->offset).yp;
        QPointerEvent::points((QPointerEvent *)in_RCX);
        QVar7 = panOffset(in_stack_ffffffffffffff48,maxCount);
        local_30 = QVar7.xp;
        (pQVar3->offset).xp = local_30;
        local_28 = QVar7.yp;
        (pQVar3->offset).yp = local_28;
      }
      QFlags<QGestureRecognizer::ResultFlag>::QFlags
                ((QFlags<QGestureRecognizer::ResultFlag> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c);
      local_c.i = local_34;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QFlagsStorageHelper<QGestureRecognizer::ResultFlag,_4>)
         (QFlagsStorageHelper<QGestureRecognizer::ResultFlag,_4>)local_c.i;
}

Assistant:

QGestureRecognizer::Result QPanGestureRecognizer::recognize(QGesture *state,
                                                            QObject *,
                                                            QEvent *event)
{
    QPanGesture *q = static_cast<QPanGesture *>(state);
    QPanGesturePrivate *d = q->d_func();

    QGestureRecognizer::Result result = QGestureRecognizer::Ignore;
    switch (event->type()) {
    case QEvent::TouchBegin: {
        result = QGestureRecognizer::MayBeGesture;
        d->lastOffset = d->offset = QPointF();
        d->pointCount = m_pointCount;
        break;
    }
    case QEvent::TouchEnd: {
        if (q->state() != Qt::NoGesture) {
            const QTouchEvent *ev = static_cast<const QTouchEvent *>(event);
            if (ev->points().size() == d->pointCount) {
                d->lastOffset = d->offset;
                d->offset = panOffset(ev->points(), d->pointCount);
            }
            result = QGestureRecognizer::FinishGesture;
        } else {
            result = QGestureRecognizer::CancelGesture;
        }
        break;
    }
    case QEvent::TouchUpdate: {
        const QTouchEvent *ev = static_cast<const QTouchEvent *>(event);
        if (ev->points().size() >= d->pointCount) {
            d->lastOffset = d->offset;
            d->offset = panOffset(ev->points(), d->pointCount);
            if (d->offset.x() > 10  || d->offset.y() > 10 ||
                d->offset.x() < -10 || d->offset.y() < -10) {
                q->setHotSpot(ev->points().first().globalPressPosition());
                result = QGestureRecognizer::TriggerGesture;
            } else {
                result = QGestureRecognizer::MayBeGesture;
            }
        }
        break;
    }
    default:
        break;
    }
    return result;
}